

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qnetworkaccessbackend.cpp
# Opt level: O0

void __thiscall
QNetworkAccessBackend::setAttribute(QNetworkAccessBackend *this,Attribute attribute,QVariant *value)

{
  bool bVar1;
  QNetworkAccessBackendPrivate *pQVar2;
  long in_FS_OFFSET;
  QNetworkAccessBackendPrivate *d;
  undefined1 in_stack_ffffffffffffffc8 [16];
  char local_c [4];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar2 = d_func((QNetworkAccessBackend *)0x188d6e);
  bVar1 = QVariant::isValid(in_stack_ffffffffffffffc8._8_8_);
  if (bVar1) {
    QHash<QNetworkRequest::Attribute,_QVariant>::insert
              (in_stack_ffffffffffffffc8._8_8_,in_stack_ffffffffffffffc8._0_8_,(QVariant *)0x188da9)
    ;
  }
  else {
    QHash<QNetworkRequest::Attribute,_QVariant>::remove
              (&(pQVar2->m_reply->super_QNetworkReplyPrivate).super_QNetworkHeadersPrivate.
                attributes,local_c);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QNetworkAccessBackend::setAttribute(QNetworkRequest::Attribute attribute,
                                         const QVariant &value)
{
    Q_D(QNetworkAccessBackend);
    if (value.isValid())
        d->m_reply->attributes.insert(attribute, value);
    else
        d->m_reply->attributes.remove(attribute);
}